

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

typed_option<std::vector<float,_std::allocator<float>_>_> * __thiscall
VW::config::typed_option<std::vector<float,_std::allocator<float>_>_>::value
          (typed_option<std::vector<float,_std::allocator<float>_>_> *this,
          vector<float,_std::allocator<float>_> *value)

{
  typed_option<std::vector<float,_std::allocator<float>_>_> *in_RDI;
  vector<float,_std::allocator<float>_> *in_stack_00000008;
  shared_ptr<std::vector<float,_std::allocator<float>_>_> *in_stack_ffffffffffffffe0;
  
  std::
  make_shared<std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>&>
            (in_stack_00000008);
  std::shared_ptr<std::vector<float,_std::allocator<float>_>_>::operator=
            (in_stack_ffffffffffffffe0,
             (shared_ptr<std::vector<float,_std::allocator<float>_>_> *)in_RDI);
  std::shared_ptr<std::vector<float,_std::allocator<float>_>_>::~shared_ptr
            ((shared_ptr<std::vector<float,_std::allocator<float>_>_> *)0x3a0040);
  return in_RDI;
}

Assistant:

typed_option& value(T value)
  {
    m_value = std::make_shared<T>(value);
    return *this;
  }